

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

QAM * __thiscall Quartet::amlist(QAM *__return_storage_ptr__,Quartet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  iVar2 = (this->bra).left.ijk._M_elems[1];
  iVar3 = (this->bra).right.ijk._M_elems[1];
  iVar4 = (this->bra).left.ijk._M_elems[0];
  iVar5 = (this->bra).left.ijk._M_elems[2];
  iVar6 = (this->bra).right.ijk._M_elems[0];
  iVar7 = (this->bra).right.ijk._M_elems[2];
  iVar8 = (this->ket).left.ijk._M_elems[1];
  iVar9 = (this->ket).left.ijk._M_elems[0];
  iVar10 = (this->ket).left.ijk._M_elems[2];
  iVar11 = (this->ket).right.ijk._M_elems[1];
  iVar12 = (this->ket).right.ijk._M_elems[0];
  iVar13 = (this->ket).right.ijk._M_elems[2];
  std::__cxx11::string::string((string *)&local_50,(string *)&this->tag);
  (__return_storage_ptr__->qam)._M_elems[0] = iVar2 + iVar4 + iVar5;
  (__return_storage_ptr__->qam)._M_elems[1] = iVar3 + iVar6 + iVar7;
  (__return_storage_ptr__->qam)._M_elems[2] = iVar8 + iVar9 + iVar10;
  (__return_storage_ptr__->qam)._M_elems[3] = iVar11 + iVar12 + iVar13;
  paVar1 = &(__return_storage_ptr__->tag).field_2;
  (__return_storage_ptr__->tag)._M_dataplus._M_p = (pointer)paVar1;
  if (local_50 == &local_40) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(__return_storage_ptr__->tag).field_2 + 8) = uStack_38;
  }
  else {
    (__return_storage_ptr__->tag)._M_dataplus._M_p = local_50;
    (__return_storage_ptr__->tag).field_2._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  (__return_storage_ptr__->tag)._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

int am(void) const { return ijk[0] + ijk[1] + ijk[2]; }